

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QJsonObject convertToJsonObject(QCborContainerPrivate *d,ConversionMode mode)

{
  QExplicitlySharedDataPointer<QCborContainerPrivate> QVar1;
  ConversionMode in_EDX;
  undefined4 in_register_00000034;
  QCborContainerPrivate *d_00;
  ulong idx;
  long in_FS_OFFSET;
  QString local_68;
  QJsonValue local_50;
  totally_ordered_wrapper<QCborContainerPrivate_*> local_38;
  
  d_00 = (QCborContainerPrivate *)CONCAT44(in_register_00000034,mode);
  local_38.ptr = *(QCborContainerPrivate **)(in_FS_OFFSET + 0x28);
  *(undefined1 **)d = &DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)d);
  if ((d_00 != (QCborContainerPrivate *)0x0) && ((d_00->elements).d.size != 0)) {
    idx = 0;
    do {
      makeString(&local_68,d_00,idx,FromRaw);
      qt_convertToJson(&local_50,d_00,idx + 1,in_EDX);
      QJsonObject::insert((QJsonObject *)d,&local_68,&local_50);
      QJsonValue::~QJsonValue(&local_50);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      idx = idx + 2;
    } while (idx < (ulong)(d_00->elements).d.size);
  }
  QVar1.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)
                ((totally_ordered_wrapper<QCborContainerPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr;
  if (QVar1.d.ptr == (totally_ordered_wrapper<QCborContainerPrivate_*>)local_38.ptr) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)QVar1.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonObject convertToJsonObject(QCborContainerPrivate *d,
                                       ConversionMode mode = ConversionMode::FromRaw)
{
    QJsonObject o;
    if (d) {
        for (qsizetype idx = 0; idx < d->elements.size(); idx += 2)
            o.insert(makeString(d, idx), qt_convertToJson(d, idx + 1, mode));
    }
    return o;
}